

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O2

bool __thiscall tsip::revert_to_default(tsip *this,int seg_num)

{
  bool bVar1;
  long lVar2;
  _command_packet *p_Var3;
  UINT8 *pUVar4;
  _command_packet in_stack_ffffffffffffffb8;
  
  *(undefined2 *)&this->m_command = 0x458e;
  (this->m_command).raw.data[2] = (UINT8)seg_num;
  (this->m_command).raw.cmd_len = '\x03';
  p_Var3 = &this->m_command;
  pUVar4 = &stack0xffffffffffffffb8;
  for (lVar2 = 0x44; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pUVar4 = (p_Var3->raw).data[0];
    p_Var3 = (_command_packet *)((long)p_Var3 + 1);
    pUVar4 = pUVar4 + 1;
  }
  bVar1 = send_request_msg(this,in_stack_ffffffffffffffb8);
  return bVar1;
}

Assistant:

bool tsip::revert_to_default(int seg_num=0xff) {
	bool rc;

	//build 8E- request - set autosave
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = COMMAND_REVERT_TO_DEFAULT;
	m_command.extended.data[0] = seg_num;

	m_command.extended.cmd_len = 3;

	rc = send_request_msg(m_command);
	return rc;
}